

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::GenerateDoneFile(cmCTest *this)

{
  bool bVar1;
  pointer pPVar2;
  ostream *this_00;
  char *msg;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_530;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  undefined1 local_4b0 [8];
  cmXMLWriter xml;
  string local_450 [32];
  undefined1 local_430 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_2a1;
  string local_2a0;
  undefined1 local_280 [8];
  cmGeneratedFileStream ofs;
  cmCTest *this_local;
  
  ofs._608_8_ = this;
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_280,None);
  pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"Done.xml",&local_2a1);
  bVar1 = OpenOutputFile(this,&pPVar2->CurrentTag,&local_2a0,(cmGeneratedFileStream *)local_280,
                         false);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_430);
    this_00 = std::operator<<((ostream *)local_430,"Cannot open done file");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x651,msg,false);
    std::__cxx11::string::~string(local_450);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_430);
    xml._84_4_ = 1;
  }
  else {
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_4b0,(ostream *)local_280,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_4b0,"UTF-8");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"Done",&local_4d1);
    cmXMLWriter::StartElement((cmXMLWriter *)local_4b0,&local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"buildId",&local_4f9);
    pPVar2 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_4b0,&local_4f8,&pPVar2->BuildID)
    ;
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator(&local_4f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"time",&local_521);
    local_530.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              ((cmXMLWriter *)local_4b0,&local_520,&local_530);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator(&local_521);
    cmXMLWriter::EndElement((cmXMLWriter *)local_4b0);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_4b0);
    xml._84_4_ = 1;
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_4b0);
  }
  this_local._4_4_ = (uint)bVar1;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
  return this_local._4_4_;
}

Assistant:

int cmCTest::GenerateDoneFile()
{
  cmGeneratedFileStream ofs;
  if (!this->OpenOutputFile(this->Impl->CurrentTag, "Done.xml", ofs)) {
    cmCTestLog(this, ERROR_MESSAGE, "Cannot open done file" << std::endl);
    return 1;
  }
  cmXMLWriter xml(ofs);
  xml.StartDocument();
  xml.StartElement("Done");
  xml.Element("buildId", this->Impl->BuildID);
  xml.Element("time", std::chrono::system_clock::now());
  xml.EndElement(); // Done
  xml.EndDocument();

  return 0;
}